

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestInNewline::Run(ParserTestInNewline *this)

{
  Test *pTVar1;
  Rule *this_00;
  int iVar2;
  bool bVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar5;
  size_type sVar6;
  pointer ppVar7;
  string *__rhs;
  EvalString *this_01;
  reference ppEVar8;
  string local_a8;
  Edge *local_88;
  Edge *edge;
  allocator<char> local_69;
  string local_68;
  string local_48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
  local_28;
  Rule *local_20;
  Rule *rule;
  ParserTestInNewline *pPStack_10;
  int fail_count;
  ParserTestInNewline *this_local;
  
  pPStack_10 = this;
  rule._4_4_ = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat_rsp\n  command = cat $in_newline > $out\n\nbuild out: cat_rsp in in2\n  rspfile=out.rsp\n"
            );
  iVar2 = rule._4_4_;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    pmVar5 = BindingEnv::GetRules_abi_cxx11_(&(this->super_ParserTest).state.bindings_);
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
            ::size(pmVar5);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar6 == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x88,"2u == state.bindings_.GetRules().size()");
    if (bVar3) {
      pmVar5 = BindingEnv::GetRules_abi_cxx11_(&(this->super_ParserTest).state.bindings_);
      local_28._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
           ::begin(pmVar5);
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
               ::operator->(&local_28);
      pTVar1 = g_current_test;
      local_20 = ppVar7->second;
      __rhs = Rule::name_abi_cxx11_(local_20);
      bVar3 = std::operator==("cat_rsp",__rhs);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x8a,"\"cat_rsp\" == rule->name()");
      this_00 = local_20;
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"command",&local_69);
      this_01 = Rule::GetBinding(this_00,&local_68);
      EvalString::Serialize_abi_cxx11_(&local_48,this_01);
      bVar3 = std::operator==("[cat ][$in_newline][ > ][$out]",&local_48);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x8c,
                 "\"[cat ][$in_newline][ > ][$out]\" == rule->GetBinding(\"command\")->Serialize()")
      ;
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      ppEVar8 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          (&(this->super_ParserTest).state.edges_,0);
      pTVar1 = g_current_test;
      local_88 = *ppEVar8;
      Edge::EvaluateCommand_abi_cxx11_(&local_a8,local_88,false);
      bVar3 = std::operator==("cat in\nin2 > out",&local_a8);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x8f,"\"cat in\\nin2 > out\" == edge->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, InNewline) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat_rsp\n"
"  command = cat $in_newline > $out\n"
"\n"
"build out: cat_rsp in in2\n"
"  rspfile=out.rsp\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat_rsp", rule->name());
  EXPECT_EQ("[cat ][$in_newline][ > ][$out]",
            rule->GetBinding("command")->Serialize());

  Edge* edge = state.edges_[0];
  EXPECT_EQ("cat in\nin2 > out", edge->EvaluateCommand());
}